

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

int * Wln_RetHeadToTail(Wln_Ret_t *p,int *pHead)

{
  int *piVar1;
  int i;
  
  i = *pHead;
  do {
    piVar1 = pHead;
    if (i == 0) {
      __assert_fail("pHead[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                    ,0x15e,"int *Wln_RetHeadToTail(Wln_Ret_t *, int *)");
    }
    pHead = Vec_IntEntryP(&p->vEdgeLinks,i);
    i = *pHead;
  } while (i != 0);
  return piVar1;
}

Assistant:

int * Wln_RetHeadToTail( Wln_Ret_t * p, int * pHead )
{
    int * pLink;
    assert( pHead[0] );
    pLink = Vec_IntEntryP( &p->vEdgeLinks, pHead[0] );
    if ( pLink[0] == 0 )
        return pHead;
    return Wln_RetHeadToTail( p, pLink );
}